

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_tap.cpp
# Opt level: O0

void __thiscall tst_qpromise_tap::rejectedSync(tst_qpromise_tap *this)

{
  bool bVar1;
  byte bVar2;
  bool local_b6;
  bool local_b5 [5];
  QString local_b0;
  QString local_98;
  QString local_80;
  undefined1 *local_68;
  QString local_50;
  QPromiseBase<int> local_38;
  undefined1 local_28 [8];
  QPromise<int> p;
  int value;
  tst_qpromise_tap *this_local;
  
  p.super_QPromiseBase<int>.m_d.d._4_4_ = -1;
  QString::QString(&local_50,"foo");
  QtPromise::QPromiseBase<int>::reject<QString>(&local_38,&local_50);
  local_68 = (undefined1 *)((long)&p.super_QPromiseBase<int>.m_d.d + 4);
  QtPromise::QPromiseBase<int>::tap<tst_qpromise_tap::rejectedSync()::__0>
            ((QPromiseBase<int> *)local_28,(anon_class_8_1_a8c68091)&local_38);
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)&local_38);
  QString::~QString(&local_50);
  QString::QString(&local_98);
  waitForError<int,QString>(&local_80,(QPromise<int> *)local_28,&local_98);
  QString::QString(&local_b0,"foo");
  bVar1 = QTest::qCompare(&local_80,&local_b0,"waitForError(p, QString{})","QString{\"foo\"}",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_tap.cpp"
                          ,0x84);
  QString::~QString(&local_b0);
  QString::~QString(&local_80);
  QString::~QString(&local_98);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_b5[0] = QtPromise::QPromiseBase<int>::isRejected((QPromiseBase<int> *)local_28);
    local_b6 = true;
    bVar1 = QTest::qCompare<bool,bool>
                      (local_b5,&local_b6,"p.isRejected()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_tap.cpp"
                       ,0x85);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      bVar2 = QTest::qCompare(p.super_QPromiseBase<int>.m_d.d._4_4_,-1,"value","-1",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_tap.cpp"
                              ,0x86);
      if ((bVar2 & 1) == 0) {
        local_b5[1] = true;
        local_b5[2] = false;
        local_b5[3] = false;
        local_b5[4] = false;
      }
      else {
        local_b5[1] = false;
        local_b5[2] = false;
        local_b5[3] = false;
        local_b5[4] = false;
      }
    }
    else {
      local_b5[1] = true;
      local_b5[2] = false;
      local_b5[3] = false;
      local_b5[4] = false;
    }
  }
  else {
    local_b5[1] = true;
    local_b5[2] = false;
    local_b5[3] = false;
    local_b5[4] = false;
  }
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_28);
  return;
}

Assistant:

void tst_qpromise_tap::rejectedSync()
{
    int value = -1;
    auto p = QtPromise::QPromise<int>::reject(QString{"foo"}).tap([&](int res) {
        value = res + 1;
    });

    QCOMPARE(waitForError(p, QString{}), QString{"foo"});
    QCOMPARE(p.isRejected(), true);
    QCOMPARE(value, -1);
}